

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_tlbsync(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  
  if (ctx->gtse == true) {
    if (ctx->pr == false) {
LAB_00b86e83:
      if ((ctx->insns_flags & 0x10000000000000) != 0) {
        uVar1._0_1_ = ctx->lazy_tlb_flush;
        uVar1._1_1_ = ctx->need_access_type;
        uVar1._2_2_ = *(undefined2 *)&ctx->field_0x36;
        gen_check_tlb_flush((DisasContext_conflict10 *)(ulong)uVar1,SUB81(ctx->uc->tcg_ctx,0));
        return;
      }
      return;
    }
  }
  else if ((ctx->pr == false) && (ctx->hv != false)) goto LAB_00b86e83;
  gen_exception_err(ctx,6,0x31);
  return;
}

Assistant:

static void gen_tlbsync(DisasContext *ctx)
{
    if (ctx->gtse) {
        CHK_SV; /* If gtse is set then tlbsync is supervisor privileged */
    } else {
        CHK_HV; /* Else hypervisor privileged */
    }

    /* BookS does both ptesync and tlbsync make tlbsync a nop for server */
    if (ctx->insns_flags & PPC_BOOKE) {
        gen_check_tlb_flush(ctx, true);
    }
}